

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3PagerSavepoint(Pager *pPager,int op,int iSavepoint)

{
  uint uVar1;
  u32 uVar2;
  Wal *pWal;
  PagerSavepoint *pPVar3;
  sqlite3_file *psVar4;
  sqlite3_io_methods *psVar5;
  u32 *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  sqlite3_io_methods *p_00;
  bool bVar11;
  u32 uVar12;
  u32 uVar13;
  PgHdr *pPVar14;
  Pgno *pPVar15;
  uint uVar16;
  long lVar17;
  i64 journalSize;
  uint uVar18;
  long lVar19;
  MemJournal *p;
  int iVar20;
  i64 *piVar21;
  bool bVar22;
  u32 dummy;
  Bitvec *local_50;
  ulong local_48;
  PagerSavepoint *local_40;
  u32 local_34;
  
  if (pPager->errCode != 0) {
    return pPager->errCode;
  }
  if (pPager->nSavepoint <= iSavepoint) {
    return 0;
  }
  iVar20 = (uint)(op != 1) + iSavepoint;
  if (iVar20 < pPager->nSavepoint) {
    lVar17 = (ulong)(op != 1) + (long)iSavepoint;
    lVar19 = lVar17 * 0x30 + 0x10;
    do {
      sqlite3BitvecDestroy(*(Bitvec **)((long)pPager->aSavepoint->aWalData + lVar19 + -0x20));
      lVar17 = lVar17 + 1;
      lVar19 = lVar19 + 0x30;
    } while (lVar17 < pPager->nSavepoint);
  }
  pPager->nSavepoint = iVar20;
  if (op == 1) {
    if (iVar20 != 0) {
      return 0;
    }
    psVar4 = pPager->sjfd;
    if (psVar4->pMethods != (sqlite3_io_methods *)0x0) {
      if (psVar4->pMethods == &MemJournalMethods) {
        p_00 = psVar4[3].pMethods;
        while (p_00 != (sqlite3_io_methods *)0x0) {
          psVar5 = *(sqlite3_io_methods **)p_00;
          sqlite3_free(p_00);
          p_00 = psVar5;
        }
        *(undefined4 *)&psVar4[2].pMethods = 0;
        psVar4[5].pMethods = (sqlite3_io_methods *)0x0;
        psVar4[6].pMethods = (sqlite3_io_methods *)0x0;
        psVar4[3].pMethods = (sqlite3_io_methods *)0x0;
        psVar4[4].pMethods = (sqlite3_io_methods *)0x0;
        psVar4[7].pMethods = (sqlite3_io_methods *)0x0;
      }
      pPager->nSubRec = 0;
      return 0;
    }
    return 0;
  }
  pWal = pPager->pWal;
  if ((pWal == (Wal *)0x0) && (pPager->jfd->pMethods == (sqlite3_io_methods *)0x0)) {
    return 0;
  }
  if (iVar20 == 0) {
LAB_0012b065:
    pPager->dbSize = pPager->dbOrigSize;
    pPager->changeCountDone = pPager->tempFile;
    if (pWal != (Wal *)0x0) {
      if (pWal->writeLock == '\0') {
        iVar20 = 0;
      }
      else {
        uVar18 = (pWal->hdr).mxFrame;
        puVar6 = *pWal->apWiData;
        uVar12 = puVar6[0];
        uVar13 = puVar6[1];
        uVar7 = *(undefined8 *)(puVar6 + 2);
        uVar2 = puVar6[5];
        uVar8 = *(undefined8 *)(puVar6 + 6);
        uVar9 = *(undefined8 *)(puVar6 + 8);
        uVar10 = *(undefined8 *)(puVar6 + 10);
        (pWal->hdr).mxFrame = puVar6[4];
        (pWal->hdr).nPage = uVar2;
        *(undefined8 *)(pWal->hdr).aFrameCksum = uVar8;
        (pWal->hdr).iVersion = uVar12;
        (pWal->hdr).unused = uVar13;
        (pWal->hdr).iChange = (int)uVar7;
        (pWal->hdr).isInit = (char)((ulong)uVar7 >> 0x20);
        (pWal->hdr).bigEndCksum = (char)((ulong)uVar7 >> 0x28);
        (pWal->hdr).szPage = (short)((ulong)uVar7 >> 0x30);
        *(undefined8 *)(pWal->hdr).aSalt = uVar9;
        *(undefined8 *)(pWal->hdr).aCksum = uVar10;
        uVar16 = (pWal->hdr).mxFrame;
        iVar20 = 0;
        if (uVar16 + 1 <= uVar18) {
          uVar16 = uVar16 + 0x1001;
          do {
            if (((ulong)uVar16 + 0xffffffff021 & 0xffffffff000) == 0) {
              pPVar15 = *pWal->apWiData + (ulong)(uVar16 - 0x1000) + 0x21;
            }
            else {
              pPVar15 = (Pgno *)((ulong)((uVar16 - 0xfdf & 0xfff) << 2) +
                                (long)pWal->apWiData[(int)((ulong)uVar16 + 0xffffffff021 >> 0xc)]);
            }
            iVar20 = pagerUndoCallback(pPager,*pPVar15);
          } while ((iVar20 == 0) && (uVar1 = uVar16 - 0xfff, uVar16 = uVar16 + 1, uVar1 <= uVar18));
          uVar16 = (pWal->hdr).mxFrame;
        }
        if (uVar18 != uVar16) {
          walCleanupHash(pWal);
        }
      }
      pPVar14 = sqlite3PcacheDirtyList(pPager->pPCache);
      if (iVar20 == 0 && pPVar14 != (PgHdr *)0x0) {
        do {
          pPVar15 = &pPVar14->pgno;
          pPVar14 = pPVar14->pDirty;
          iVar20 = pagerUndoCallback(pPager,*pPVar15);
          if (pPVar14 == (PgHdr *)0x0) {
            return iVar20;
          }
        } while (iVar20 == 0);
        return iVar20;
      }
      return iVar20;
    }
    journalSize = pPager->journalOff;
    bVar11 = true;
    local_50 = (Bitvec *)0x0;
    local_40 = (PagerSavepoint *)0x0;
LAB_0012b16f:
    pPager->journalOff = 0;
LAB_0012b176:
    do {
      piVar21 = &pPager->journalOff;
      if (journalSize <= *piVar21) {
        iVar20 = 0;
        break;
      }
      local_48 = local_48 & 0xffffffff00000000;
      iVar20 = readJournalHdr(pPager,0,journalSize,(u32 *)&local_48,&local_34);
      uVar18 = (uint)local_48;
      if ((uint)local_48 == 0) {
        lVar17 = (ulong)pPager->sectorSize + pPager->journalHdr;
        if (lVar17 == pPager->journalOff) {
          uVar18 = (uint)((journalSize - lVar17) / ((long)pPager->pageSize + 8));
          goto LAB_0012b1d3;
        }
      }
      else {
LAB_0012b1d3:
        if ((iVar20 == 0) && (uVar18 != 0)) {
          uVar16 = 1;
          while (*piVar21 < journalSize) {
            iVar20 = pager_playback_one_page(pPager,piVar21,local_50,1,1);
            if ((iVar20 != 0) || (bVar22 = uVar18 <= uVar16, uVar16 = uVar16 + 1, bVar22))
            goto LAB_0012b218;
          }
          iVar20 = 0;
        }
      }
LAB_0012b218:
    } while (iVar20 == 0);
    if (bVar11) goto LAB_0012b2e4;
  }
  else {
    pPVar3 = pPager->aSavepoint;
    if (pPVar3 + (long)iVar20 + -1 == (PagerSavepoint *)0x0) goto LAB_0012b065;
    uVar2 = pPVar3[(long)iVar20 + -1].nOrig;
    local_50 = (Bitvec *)sqlite3Malloc(0x200);
    if (local_50 == (Bitvec *)0x0) {
      return 7;
    }
    bVar11 = false;
    local_40 = pPVar3 + (long)iVar20 + -1;
    memset(&local_50->nSet,0,0x1fc);
    local_50->iSize = uVar2;
    pPager->dbSize = pPVar3[(long)iVar20 + -1].nOrig;
    pPager->changeCountDone = pPager->tempFile;
    piVar21 = &pPager->journalOff;
    journalSize = pPager->journalOff;
    if (pPager->pWal != (Wal *)0x0) goto LAB_0012b16f;
    lVar17 = pPVar3[(long)iVar20 + -1].iHdrOffset;
    if (pPVar3[(long)iVar20 + -1].iHdrOffset == 0) {
      lVar17 = journalSize;
    }
    *piVar21 = pPVar3[(long)iVar20 + -1].iOffset;
    do {
      if (lVar17 <= *piVar21) {
        bVar11 = false;
        goto LAB_0012b176;
      }
      iVar20 = pager_playback_one_page(pPager,piVar21,local_50,1,1);
    } while (iVar20 == 0);
  }
  pPVar3 = local_40;
  uVar18 = local_40->iSubRec;
  local_48 = ((long)pPager->pageSize + 4) * (ulong)uVar18;
  if (pPager->pWal == (Wal *)0x0) {
    if (iVar20 != 0) goto LAB_0012b2e4;
  }
  else {
    sqlite3WalSavepointUndo(pPager->pWal,local_40->aWalData);
    uVar18 = pPVar3->iSubRec;
  }
  uVar18 = uVar18 - 1;
  do {
    uVar18 = uVar18 + 1;
    iVar20 = 0;
    if (pPager->nSubRec <= uVar18) break;
    iVar20 = pager_playback_one_page(pPager,(i64 *)&local_48,local_50,0,1);
  } while (iVar20 == 0);
LAB_0012b2e4:
  sqlite3BitvecDestroy(local_50);
  if (iVar20 == 0) {
    pPager->journalOff = journalSize;
    return 0;
  }
  return iVar20;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSavepoint(Pager *pPager, int op, int iSavepoint){
  int rc = pPager->errCode;
  
#ifdef SQLITE_ENABLE_ZIPVFS
  if( op==SAVEPOINT_RELEASE ) rc = SQLITE_OK;
#endif

  assert( op==SAVEPOINT_RELEASE || op==SAVEPOINT_ROLLBACK );
  assert( iSavepoint>=0 || op==SAVEPOINT_ROLLBACK );

  if( rc==SQLITE_OK && iSavepoint<pPager->nSavepoint ){
    int ii;            /* Iterator variable */
    int nNew;          /* Number of remaining savepoints after this op. */

    /* Figure out how many savepoints will still be active after this
    ** operation. Store this value in nNew. Then free resources associated 
    ** with any savepoints that are destroyed by this operation.
    */
    nNew = iSavepoint + (( op==SAVEPOINT_RELEASE ) ? 0 : 1);
    for(ii=nNew; ii<pPager->nSavepoint; ii++){
      sqlite3BitvecDestroy(pPager->aSavepoint[ii].pInSavepoint);
    }
    pPager->nSavepoint = nNew;

    /* If this is a release of the outermost savepoint, truncate 
    ** the sub-journal to zero bytes in size. */
    if( op==SAVEPOINT_RELEASE ){
      if( nNew==0 && isOpen(pPager->sjfd) ){
        /* Only truncate if it is an in-memory sub-journal. */
        if( sqlite3JournalIsInMemory(pPager->sjfd) ){
          rc = sqlite3OsTruncate(pPager->sjfd, 0);
          assert( rc==SQLITE_OK );
        }
        pPager->nSubRec = 0;
      }
    }
    /* Else this is a rollback operation, playback the specified savepoint.
    ** If this is a temp-file, it is possible that the journal file has
    ** not yet been opened. In this case there have been no changes to
    ** the database file, so the playback operation can be skipped.
    */
    else if( pagerUseWal(pPager) || isOpen(pPager->jfd) ){
      PagerSavepoint *pSavepoint = (nNew==0)?0:&pPager->aSavepoint[nNew-1];
      rc = pagerPlaybackSavepoint(pPager, pSavepoint);
      assert(rc!=SQLITE_DONE);
    }
    
#ifdef SQLITE_ENABLE_ZIPVFS
    /* If the cache has been modified but the savepoint cannot be rolled 
    ** back journal_mode=off, put the pager in the error state. This way,
    ** if the VFS used by this pager includes ZipVFS, the entire transaction
    ** can be rolled back at the ZipVFS level.  */
    else if( 
        pPager->journalMode==PAGER_JOURNALMODE_OFF 
     && pPager->eState>=PAGER_WRITER_CACHEMOD
    ){
      pPager->errCode = SQLITE_ABORT;
      pPager->eState = PAGER_ERROR;
      setGetterMethod(pPager);
    }
#endif
  }

  return rc;
}